

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O3

void __thiscall
cbtTriangleMeshShape::cbtTriangleMeshShape
          (cbtTriangleMeshShape *this,cbtStridingMeshInterface *meshInterface)

{
  int iVar1;
  
  cbtConcaveShape::cbtConcaveShape(&this->super_cbtConcaveShape);
  (this->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtTriangleMeshShape_00b49498;
  this->m_meshInterface = meshInterface;
  (this->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType = 0x19;
  iVar1 = (*meshInterface->_vptr_cbtStridingMeshInterface[10])(meshInterface);
  if ((char)iVar1 == '\0') {
    recalcLocalAabb(this);
  }
  else {
    (*meshInterface->_vptr_cbtStridingMeshInterface[0xc])
              (meshInterface,&this->m_localAabbMin,&this->m_localAabbMax);
  }
  return;
}

Assistant:

cbtTriangleMeshShape::cbtTriangleMeshShape(cbtStridingMeshInterface* meshInterface)
	: cbtConcaveShape(), m_meshInterface(meshInterface)
{
	m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
	if (meshInterface->hasPremadeAabb())
	{
		meshInterface->getPremadeAabb(&m_localAabbMin, &m_localAabbMax);
	}
	else
	{
		recalcLocalAabb();
	}
}